

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chunkQueue.c
# Opt level: O0

_Bool deque(queue *q)

{
  ulong uVar1;
  bool bVar2;
  queue *q_local;
  
  bVar2 = q->size != 0;
  if (bVar2) {
    q->size = q->size - 1;
    q->elements[q->head] = (chunk *)0x0;
    uVar1 = q->head + 1;
    q->head = uVar1;
    q->head = uVar1 % q->capacity;
  }
  return bVar2;
}

Assistant:

bool deque(queue* q)
{
    if (q->size <= 0) { return false; }
    else
    {
        q->size--;
        q->elements[q->head] = NULL; //remove the ptr to the element
        q->head = (++q->head) % q->capacity;
    }

    return true;
}